

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O3

void __thiscall Spi::send_byte(Spi *this,uint8_t data)

{
  undefined3 in_EAX;
  int iVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  BYTE byOutputBuffer [1];
  DWORD dwNumBytesSent;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)CONCAT13(data,in_EAX);
  iVar1 = FT_Write(this->ftHandle,(long)&uStack_18 + 3,1);
  if (iVar1 == 0) {
    if (uStack_18._4_4_ == 1) {
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Write error (single byte, received ",0x23);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    pcVar4 = ", expected 1).";
    lVar3 = 0xe;
  }
  else {
    poVar2 = (ostream *)&std::cerr;
    pcVar4 = "Write error!";
    lVar3 = 0xc;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  error(this,2);
}

Assistant:

void Spi::send_byte(uint8_t data) {
	FT_STATUS ftStatus;
	BYTE byOutputBuffer[1];
	DWORD dwNumBytesSent = 0;

	byOutputBuffer[0] = data;

	ftStatus = FT_Write(ftHandle, byOutputBuffer, 1, &dwNumBytesSent);
	if (ftStatus != FT_OK) {
		cerr << "Write error!" << endl;
		error(2);
	}
	if (dwNumBytesSent != 1) {
		cerr << "Write error (single byte, received " << dwNumBytesSent
				<< ", expected 1)." << endl;
		error(2);
	}
}